

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmatch.c
# Opt level: O1

int pmatch(char *p,char *s,uint len)

{
  char *pcVar1;
  char cVar2;
  uint in_EAX;
  uint uVar3;
  char *pcVar4;
  bool bVar5;
  
  do {
    cVar2 = *p;
    pcVar4 = s;
    uVar3 = len;
    if (cVar2 == '+') {
      pcVar1 = p + 1;
      p = p + 2;
      bVar5 = true;
      if (*pcVar1 == *s) {
        if (len == 0) {
          in_EAX = 1;
        }
        else {
          do {
            bVar5 = *pcVar4 == *pcVar1;
            if (!bVar5) goto LAB_001079b1;
            uVar3 = uVar3 - 1;
            pcVar4 = pcVar4 + 1;
          } while (uVar3 != 0);
          in_EAX = 1;
LAB_00107982:
          s = s + (ulong)(len - 1) + 1;
        }
LAB_001079af:
        pcVar4 = s;
        uVar3 = 0;
      }
      else {
LAB_0010799b:
        bVar5 = true;
        in_EAX = 0;
      }
    }
    else {
      p = p + 1;
      if (cVar2 == '*') {
        cVar2 = *p;
        bVar5 = true;
        if (cVar2 != '\0') {
          if (len != 0) {
            do {
              bVar5 = *pcVar4 != cVar2;
              if (*pcVar4 == cVar2) goto LAB_001079b1;
              uVar3 = uVar3 - 1;
              pcVar4 = pcVar4 + 1;
            } while (uVar3 != 0);
            in_EAX = 0;
            goto LAB_00107982;
          }
LAB_0010799f:
          bVar5 = true;
          in_EAX = 0;
          goto LAB_001079af;
        }
        in_EAX = 1;
      }
      else if (cVar2 == '\0') {
        in_EAX = (uint)(len == 0);
        bVar5 = true;
      }
      else {
        if (len == 0) goto LAB_0010799f;
        if (*s != cVar2) goto LAB_0010799b;
        bVar5 = false;
        pcVar4 = s + 1;
        uVar3 = len - 1;
      }
    }
LAB_001079b1:
    len = uVar3;
    s = pcVar4;
    if (bVar5) {
      return in_EAX;
    }
  } while( true );
}

Assistant:

int pmatch(const char *p, const char *s, unsigned int len) {
  for (;;) {
    char c =*p++;
    if (! c) return(! len);
    switch(c) {
    case '*':
      if (! (c =*p)) return(1);
      for (;;) {
        if (! len) return(0);
        if (*s == c) break;
        ++s; --len;
      }
      continue;
    case '+':
      if ((c =*p++) != *s) return(0);
      for (;;) {
        if (! len) return(1);
        if (*s != c) break;
        ++s; --len;
      }
      continue;
      /*
    case '?':
      if (*p == '?') {
        if (*s != '?') return(0);
        ++p;
      }
      ++s; --len;
      continue;
      */
    default:
      if (! len) return(0);
      if (*s != c) return(0);
      ++s; --len;
      continue;
    }
  }
  return(0);
}